

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int i_1;
  int l_1;
  int u_1;
  double *cumulativeScaleFactors;
  int i;
  double sum;
  int k;
  int l;
  int v;
  int u;
  double *freqs;
  double *rootPartials;
  int returnCode;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_EDX * 8);
  local_3c = 0;
  local_40 = 0;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x34); local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x14); local_48 = local_48 + 1) {
      local_50 = 0.0;
      for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x24); local_54 = local_54 + 1) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(lVar1 + (long)local_40 * 8);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(lVar2 + (long)local_54 * 8);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_50;
        auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
        local_50 = auVar4._0_8_;
        local_40 = local_40 + 1;
      }
      dVar3 = log(local_50);
      *(double *)(in_R8 + (long)local_3c * 8) = dVar3;
      local_3c = local_3c + 1;
    }
  }
  if (-1 < in_ECX) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_ECX * 8);
    local_64 = 0;
    for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x34); local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x14); local_6c = local_6c + 1) {
        *(double *)(in_R8 + (long)local_64 * 8) =
             *(double *)(lVar1 + (long)local_6c * 8) + *(double *)(in_R8 + (long)local_64 * 8);
        local_64 = local_64 + 1;
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}